

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O3

void duckdb::TernaryExecutor::
     ExecuteGeneric<duckdb::string_t,duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::TernaryLambdaWrapperWithNulls,long(*)(duckdb::string_t,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)>
               (Vector *a,Vector *b,Vector *c,Vector *result,idx_t count,
               _func_long_string_t_timestamp_t_timestamp_t_ValidityMask_ptr_unsigned_long *fun)

{
  long *plVar1;
  long lVar2;
  UnifiedVectorFormat cdata;
  timestamp_t *local_100;
  ValidityMask local_f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c8;
  UnifiedVectorFormat bdata;
  timestamp_t *local_b8;
  ValidityMask local_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  UnifiedVectorFormat adata;
  string_t *local_70;
  ValidityMask local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  if (((*a == (Vector)0x2) && (*b == (Vector)0x2)) && (*c == (Vector)0x2)) {
    duckdb::Vector::SetVectorType((VectorType)result);
    if ((((*(byte **)(a + 0x28) != (byte *)0x0) && ((**(byte **)(a + 0x28) & 1) == 0)) ||
        ((*(byte **)(b + 0x28) != (byte *)0x0 && ((**(byte **)(b + 0x28) & 1) == 0)))) ||
       ((*(byte **)(c + 0x28) != (byte *)0x0 && ((**(byte **)(c + 0x28) & 1) == 0)))) {
      duckdb::ConstantVector::SetNull(result,true);
      return;
    }
    plVar1 = *(long **)(result + 0x20);
    lVar2 = (*fun)((string_t)(*(anon_union_16_2_67f50693_for_value **)(a + 0x20))->pointer,
                   (timestamp_t)**(int64_t **)(b + 0x20),(timestamp_t)**(int64_t **)(c + 0x20),
                   (ValidityMask *)(result + 0x28),0);
    *plVar1 = lVar2;
  }
  else {
    duckdb::Vector::SetVectorType((VectorType)result);
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&adata);
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&bdata);
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&cdata);
    duckdb::Vector::ToUnifiedFormat((ulong)a,(UnifiedVectorFormat *)count);
    duckdb::Vector::ToUnifiedFormat((ulong)b,(UnifiedVectorFormat *)count);
    duckdb::Vector::ToUnifiedFormat((ulong)c,(UnifiedVectorFormat *)count);
    plVar1 = *(long **)(result + 0x20);
    FlatVector::VerifyFlatVector(result);
    ExecuteLoop<duckdb::string_t,duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::TernaryLambdaWrapperWithNulls,long(*)(duckdb::string_t,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::ValidityMask&,unsigned_long)>
              (local_70,local_b8,local_100,plVar1,count,_adata,_bdata,_cdata,&local_68,&local_b0,
               &local_f8,(ValidityMask *)(result + 0x28),fun);
    if (local_c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c8);
    }
    if (local_f8.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_f8.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
    }
    if (local_b0.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b0.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
    if (local_68.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void ExecuteGeneric(Vector &a, Vector &b, Vector &c, Vector &result, idx_t count, FUN fun) {
		if (a.GetVectorType() == VectorType::CONSTANT_VECTOR && b.GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    c.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			if (ConstantVector::IsNull(a) || ConstantVector::IsNull(b) || ConstantVector::IsNull(c)) {
				ConstantVector::SetNull(result, true);
			} else {
				auto adata = ConstantVector::GetData<A_TYPE>(a);
				auto bdata = ConstantVector::GetData<B_TYPE>(b);
				auto cdata = ConstantVector::GetData<C_TYPE>(c);
				auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);
				auto &result_validity = ConstantVector::Validity(result);
				result_data[0] = OPWRAPPER::template Operation<FUN, A_TYPE, B_TYPE, C_TYPE, RESULT_TYPE>(
				    fun, adata[0], bdata[0], cdata[0], result_validity, 0);
			}
		} else {
			result.SetVectorType(VectorType::FLAT_VECTOR);

			UnifiedVectorFormat adata, bdata, cdata;
			a.ToUnifiedFormat(count, adata);
			b.ToUnifiedFormat(count, bdata);
			c.ToUnifiedFormat(count, cdata);

			ExecuteLoop<A_TYPE, B_TYPE, C_TYPE, RESULT_TYPE, OPWRAPPER>(
			    UnifiedVectorFormat::GetData<A_TYPE>(adata), UnifiedVectorFormat::GetData<B_TYPE>(bdata),
			    UnifiedVectorFormat::GetData<C_TYPE>(cdata), FlatVector::GetData<RESULT_TYPE>(result), count,
			    *adata.sel, *bdata.sel, *cdata.sel, adata.validity, bdata.validity, cdata.validity,
			    FlatVector::Validity(result), fun);
		}
	}